

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_movem_re(m68k_info *info,int opcode,int size)

{
  uint uVar1;
  uint32_t uVar2;
  cs_m68k *pcVar3;
  byte bVar4;
  uint s;
  uint32_t uVar5;
  
  pcVar3 = build_init_op(info,0x11c,2,opcode);
  pcVar3->operands[0].type = M68K_OP_REG_BITS;
  uVar1 = read_imm_16(info);
  pcVar3->operands[0].register_bits = uVar1;
  get_ea_mode_op(info,pcVar3->operands + 1,info->ir,opcode);
  if (pcVar3->operands[1].address_mode == M68K_AM_REGI_ADDR_PRE_DEC) {
    uVar5 = pcVar3->operands[0].register_bits;
    bVar4 = 0xf;
    uVar2 = uVar5;
    while (1 < uVar5) {
      uVar5 = uVar5 >> 1;
      uVar2 = (uVar5 & 1) + uVar2 * 2;
      bVar4 = bVar4 - 1;
    }
    pcVar3->operands[0].register_bits = uVar2 << (bVar4 & 0x1f) & 0xffff;
  }
  return;
}

Assistant:

static void build_movem_re(m68k_info *info, int opcode, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->type = M68K_OP_REG_BITS;
	op0->register_bits = read_imm_16(info);

	get_ea_mode_op(info, op1, info->ir, size);

	if (op1->address_mode == M68K_AM_REGI_ADDR_PRE_DEC)
		op0->register_bits = reverse_bits(op0->register_bits);
}